

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManPushInv_rec(If_DsdMan_t *p,int iLit,uchar *pPerm)

{
  int iVar1;
  int iVar2;
  If_DsdObj_t *pObj_00;
  bool bVar3;
  int local_30;
  int local_2c;
  int iFanin;
  int i;
  If_DsdObj_t *pObj;
  uchar *pPerm_local;
  int iLit_local;
  If_DsdMan_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  pObj_00 = If_DsdVecObj(&p->vObjs,iVar1);
  iVar1 = If_DsdObjType(pObj_00);
  if (iVar1 == 2) {
    iVar1 = Abc_LitNot((uint)*pPerm);
    *pPerm = (uchar)iVar1;
  }
  else {
    iVar1 = If_DsdObjType(pObj_00);
    if (iVar1 == 4) {
      local_2c = 0;
      pObj = (If_DsdObj_t *)pPerm;
      while( true ) {
        iVar1 = If_DsdObjFaninNum(pObj_00);
        bVar3 = false;
        if (local_2c < iVar1) {
          local_30 = If_DsdObjFaninLit(pObj_00,local_2c);
          bVar3 = local_30 != 0;
        }
        if (!bVar3) {
          return 1;
        }
        iVar1 = If_DsdManCheckInv_rec(p,local_30);
        if (iVar1 != 0) break;
        iVar1 = If_DsdVecLitSuppSize(&p->vObjs,local_30);
        pObj = (If_DsdObj_t *)((long)&pObj->Id + (long)iVar1);
        local_2c = local_2c + 1;
      }
      If_DsdManPushInv_rec(p,local_30,(uchar *)pObj);
    }
    else {
      iVar1 = If_DsdObjType(pObj_00);
      if (iVar1 != 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x5d5,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
      }
      iVar1 = If_DsdManCheckInv_rec(p,*(int *)&pObj_00[1].field_0x4);
      if ((iVar1 == 0) || (iVar1 = If_DsdManCheckInv_rec(p,pObj_00[2].Id), iVar1 == 0)) {
        __assert_fail("If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x5cf,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
      }
      iVar1 = If_DsdVecLitSuppSize(&p->vObjs,pObj_00[1].Id);
      If_DsdManPushInv_rec(p,*(int *)&pObj_00[1].field_0x4,pPerm + iVar1);
      iVar2 = If_DsdVecLitSuppSize(&p->vObjs,*(int *)&pObj_00[1].field_0x4);
      If_DsdManPushInv_rec(p,pObj_00[2].Id,pPerm + iVar1 + iVar2);
    }
  }
  return 1;
}

Assistant:

int If_DsdManPushInv_rec( If_DsdMan_t * p, int iLit, unsigned char * pPerm )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        pPerm[0] = (unsigned char)Abc_LitNot((int)pPerm[0]);
    else if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            if ( If_DsdManCheckInv_rec(p, iFanin) )
            {
                If_DsdManPushInv_rec( p, iFanin, pPerm );
                break;
            }
            pPerm += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
        }
    }
    else if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        assert( If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]) );
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[0]);
        If_DsdManPushInv_rec(p, pObj->pFans[1], pPerm);
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[1]);
        If_DsdManPushInv_rec(p, pObj->pFans[2], pPerm);
    }
    else assert( 0 );
    return 1;
}